

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Branch * kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(size_t count)

{
  Branch *pBVar1;
  size_t count_local;
  
  pBVar1 = (Branch *)
           allocateImpl(0x40,count,count,Allocate_<kj::StringTree::Branch>::construct,
                        ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  return pBVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}